

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::TrendGroup::combineTrendTypeAndTimeGroup(TrendGroup *this,TrendGroup *nextTrendGroup)

{
  bool bVar1;
  Type TVar2;
  TrendGroup *in_RDI;
  TrendGroup *in_stack_00000058;
  TrendGroup *in_stack_00000060;
  TrendGroup *in_stack_00000098;
  TrendGroup *in_stack_000000d0;
  TrendGroup *in_stack_000000d8;
  
  TVar2 = type(in_RDI);
  if (((TVar2 != BECMG) && (TVar2 = type(in_RDI), TVar2 != TEMPO)) &&
     (TVar2 = type(in_RDI), TVar2 != INTER)) {
    return false;
  }
  bVar1 = isTimeSpanGroup(this);
  if ((!bVar1) && (bVar1 = isTrendTimeGroup(in_stack_00000098), !bVar1)) {
    return false;
  }
  bVar1 = canCombineTime(in_stack_000000d8,in_stack_000000d0);
  if (bVar1) {
    combineTime(in_stack_00000060,in_stack_00000058);
  }
  return bVar1;
}

Assistant:

bool TrendGroup::combineTrendTypeAndTimeGroup(const TrendGroup & nextTrendGroup) {
	if (type() != Type::BECMG &&
		type() != Type::TEMPO &&
		type() != Type::INTER) return false;
	if (!nextTrendGroup.isTimeSpanGroup() &&
		!nextTrendGroup.isTrendTimeGroup()) return false;
	if (!canCombineTime(*this, nextTrendGroup)) return false;
	combineTime(nextTrendGroup);
	return true;
}